

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O0

void __thiscall
google::protobuf::DescriptorProto::SerializeWithCachedSizes
          (DescriptorProto *this,CodedOutputStream *output)

{
  bool bVar1;
  int iVar2;
  char *data;
  string *value;
  FieldDescriptorProto *pFVar3;
  DescriptorProto *value_00;
  EnumDescriptorProto *value_01;
  DescriptorProto_ExtensionRange *value_02;
  MessageOptions *value_03;
  UnknownFieldSet *pUVar4;
  int local_2c;
  int local_28;
  int i_4;
  int i_3;
  int i_2;
  int i_1;
  int i;
  CodedOutputStream *output_local;
  DescriptorProto *this_local;
  
  bVar1 = has_name(this);
  if (bVar1) {
    name_abi_cxx11_(this);
    data = (char *)std::__cxx11::string::data();
    name_abi_cxx11_(this);
    iVar2 = std::__cxx11::string::length();
    internal::WireFormat::VerifyUTF8String(data,iVar2,SERIALIZE);
    value = name_abi_cxx11_(this);
    internal::WireFormatLite::WriteString(1,value,output);
  }
  for (i_2 = 0; iVar2 = field_size(this), i_2 < iVar2; i_2 = i_2 + 1) {
    pFVar3 = field(this,i_2);
    internal::WireFormatLite::WriteMessageMaybeToArray(2,(MessageLite *)pFVar3,output);
  }
  for (i_3 = 0; iVar2 = nested_type_size(this), i_3 < iVar2; i_3 = i_3 + 1) {
    value_00 = nested_type(this,i_3);
    internal::WireFormatLite::WriteMessageMaybeToArray(3,(MessageLite *)value_00,output);
  }
  for (i_4 = 0; iVar2 = enum_type_size(this), i_4 < iVar2; i_4 = i_4 + 1) {
    value_01 = enum_type(this,i_4);
    internal::WireFormatLite::WriteMessageMaybeToArray(4,(MessageLite *)value_01,output);
  }
  for (local_28 = 0; iVar2 = extension_range_size(this), local_28 < iVar2; local_28 = local_28 + 1)
  {
    value_02 = extension_range(this,local_28);
    internal::WireFormatLite::WriteMessageMaybeToArray(5,(MessageLite *)value_02,output);
  }
  for (local_2c = 0; iVar2 = extension_size(this), local_2c < iVar2; local_2c = local_2c + 1) {
    pFVar3 = extension(this,local_2c);
    internal::WireFormatLite::WriteMessageMaybeToArray(6,(MessageLite *)pFVar3,output);
  }
  bVar1 = has_options(this);
  if (bVar1) {
    value_03 = options(this);
    internal::WireFormatLite::WriteMessageMaybeToArray(7,(MessageLite *)value_03,output);
  }
  pUVar4 = unknown_fields(this);
  bVar1 = UnknownFieldSet::empty(pUVar4);
  if (!bVar1) {
    pUVar4 = unknown_fields(this);
    internal::WireFormat::SerializeUnknownFields(pUVar4,output);
  }
  return;
}

Assistant:

void DescriptorProto::SerializeWithCachedSizes(
    ::google::protobuf::io::CodedOutputStream* output) const {
  // optional string name = 1;
  if (has_name()) {
    ::google::protobuf::internal::WireFormat::VerifyUTF8String(
      this->name().data(), this->name().length(),
      ::google::protobuf::internal::WireFormat::SERIALIZE);
    ::google::protobuf::internal::WireFormatLite::WriteString(
      1, this->name(), output);
  }

  // repeated .google.protobuf.FieldDescriptorProto field = 2;
  for (int i = 0; i < this->field_size(); i++) {
    ::google::protobuf::internal::WireFormatLite::WriteMessageMaybeToArray(
      2, this->field(i), output);
  }

  // repeated .google.protobuf.DescriptorProto nested_type = 3;
  for (int i = 0; i < this->nested_type_size(); i++) {
    ::google::protobuf::internal::WireFormatLite::WriteMessageMaybeToArray(
      3, this->nested_type(i), output);
  }

  // repeated .google.protobuf.EnumDescriptorProto enum_type = 4;
  for (int i = 0; i < this->enum_type_size(); i++) {
    ::google::protobuf::internal::WireFormatLite::WriteMessageMaybeToArray(
      4, this->enum_type(i), output);
  }

  // repeated .google.protobuf.DescriptorProto.ExtensionRange extension_range = 5;
  for (int i = 0; i < this->extension_range_size(); i++) {
    ::google::protobuf::internal::WireFormatLite::WriteMessageMaybeToArray(
      5, this->extension_range(i), output);
  }

  // repeated .google.protobuf.FieldDescriptorProto extension = 6;
  for (int i = 0; i < this->extension_size(); i++) {
    ::google::protobuf::internal::WireFormatLite::WriteMessageMaybeToArray(
      6, this->extension(i), output);
  }

  // optional .google.protobuf.MessageOptions options = 7;
  if (has_options()) {
    ::google::protobuf::internal::WireFormatLite::WriteMessageMaybeToArray(
      7, this->options(), output);
  }

  if (!unknown_fields().empty()) {
    ::google::protobuf::internal::WireFormat::SerializeUnknownFields(
        unknown_fields(), output);
  }
}